

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rectangle.h
# Opt level: O2

rectangle * dlib::move_rect(rectangle *__return_storage_ptr__,rectangle *rect,long x,long y)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  
  uVar1 = rectangle::width(rect);
  uVar2 = rectangle::height(rect);
  __return_storage_ptr__->l = x;
  __return_storage_ptr__->t = y;
  __return_storage_ptr__->r = x + uVar1 + -1;
  __return_storage_ptr__->b = uVar2 + y + -1;
  return __return_storage_ptr__;
}

Assistant:

inline const rectangle move_rect (
        const rectangle& rect,
        long x,
        long y 
    )
    {
        return rectangle(x, y, x+rect.width()-1, y+rect.height()-1);
    }